

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O3

void LiteScript::State::Save(ostream *stream,State *state)

{
  pointer pvVar1;
  ostream *stream_00;
  OStreamer *pOVar2;
  Object *pOVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  OStreamer streamer;
  OStreamer local_50;
  char local_44 [4];
  ulong local_40;
  ostream *local_38;
  
  local_50.stream = stream;
  local_38 = stream;
  pOVar2 = OStreamer::operator<<(&local_50,&state->instr_index);
  OStreamer::operator<<(pOVar2,&state->line_num);
  pOVar3 = Variable::operator->(&state->nsp_global);
  OStreamer::operator<<(&local_50,&pOVar3->ID);
  std::ostream::_M_insert<unsigned_long>((ulong)local_50.stream);
  uVar4 = ((long)(state->args_tmp).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(state->args_tmp).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((int)uVar4 != 0) {
    local_40 = uVar4 & 0xffffffff;
    uVar4 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)local_50.stream);
      pvVar1 = (state->args_tmp).
               super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)*(pointer *)
                     ((long)&pvVar1[uVar4].
                             super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              *(long *)&pvVar1[uVar4].
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data;
      if ((uVar5 & 0xffffffff0) != 0) {
        uVar5 = uVar5 >> 4 & 0xffffffff;
        lVar6 = 0;
        do {
          pOVar3 = Variable::operator->
                             ((Variable *)
                              (*(long *)&(state->args_tmp).
                                         super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                         super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                         ._M_impl.super__Vector_impl_data + lVar6));
          OStreamer::operator<<(&local_50,&pOVar3->ID);
          lVar6 = lVar6 + 0x10;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_40);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_50.stream);
  uVar4 = ((long)(state->args_def).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(state->args_def).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((int)uVar4 != 0) {
    local_40 = uVar4 & 0xffffffff;
    uVar4 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)local_50.stream);
      pvVar1 = (state->args_def).
               super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)*(pointer *)
                     ((long)&pvVar1[uVar4].
                             super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              *(long *)&pvVar1[uVar4].
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data;
      if ((uVar5 & 0xffffffff0) != 0) {
        uVar5 = uVar5 >> 4 & 0xffffffff;
        lVar6 = 0;
        do {
          pOVar3 = Variable::operator->
                             ((Variable *)
                              (*(long *)&(state->args_def).
                                         super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                         super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                         ._M_impl.super__Vector_impl_data + lVar6));
          OStreamer::operator<<(&local_50,&pOVar3->ID);
          lVar6 = lVar6 + 0x10;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_40);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_50.stream);
  uVar4 = (long)(state->ths).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(state->ths).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar4 & 0x1fffffffe0) != 0) {
    uVar4 = uVar4 >> 5 & 0xffffffff;
    lVar6 = 0;
    do {
      if (**(char **)(((state->ths).
                       super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->data + lVar6 + 0x18) == '\x01') {
        local_44[0] = '\0';
        std::__ostream_insert<char,std::char_traits<char>>(local_50.stream,local_44,1);
      }
      else {
        local_44[1] = 1;
        std::__ostream_insert<char,std::char_traits<char>>(local_50.stream,local_44 + 1,1);
        pOVar3 = Variable::operator->
                           ((Variable *)
                            (((state->ths).
                              super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->data + lVar6));
        OStreamer::operator<<(&local_50,&pOVar3->ID);
      }
      lVar6 = lVar6 + 0x20;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_50.stream);
  uVar4 = (long)(state->rets).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(state->rets).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar4 & 0x1fffffffe0) != 0) {
    uVar4 = uVar4 >> 5 & 0xffffffff;
    lVar6 = 0;
    do {
      if (**(char **)(((state->rets).
                       super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->data + lVar6 + 0x18) == '\x01') {
        local_44[2] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(local_50.stream,local_44 + 2,1);
      }
      else {
        local_44[3] = 1;
        std::__ostream_insert<char,std::char_traits<char>>(local_50.stream,local_44 + 3,1);
        pOVar3 = Variable::operator->
                           ((Variable *)
                            (((state->rets).
                              super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->data + lVar6));
        OStreamer::operator<<(&local_50,&pOVar3->ID);
      }
      lVar6 = lVar6 + 0x20;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_50.stream);
  uVar4 = (long)(state->op_lifo).
                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(state->op_lifo).
                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if ((uVar4 & 0xffffffff0) != 0) {
    uVar4 = uVar4 >> 4 & 0xffffffff;
    lVar6 = 0;
    do {
      pOVar3 = Variable::operator->
                         ((Variable *)
                          ((long)&((state->op_lifo).
                                   super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->obj + lVar6));
      OStreamer::operator<<(&local_50,&pOVar3->ID);
      lVar6 = lVar6 + 0x10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_50.stream);
  uVar4 = (ulong)((long)(state->call_lifo).
                        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(state->call_lifo).
                       super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar4 != 0) {
    uVar4 = uVar4 & 0xffffffff;
    lVar6 = 0;
    do {
      pOVar2 = OStreamer::operator<<
                         (&local_50,
                          (uint *)((long)((state->call_lifo).
                                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                  lVar6));
      OStreamer::operator<<
                (pOVar2,(uint *)((long)((state->call_lifo).
                                        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                lVar6 + 4));
      lVar6 = lVar6 + 8;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_50.stream);
  stream_00 = local_38;
  uVar4 = ((long)(state->nsp_lifo).
                 super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(state->nsp_lifo).
                 super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  if ((int)uVar4 != 0) {
    lVar6 = 0;
    do {
      Namer::SaveIDs((Namer *)((((state->nsp_lifo).
                                 super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->current).data +
                              lVar6 + -0x10),stream_00);
      lVar6 = lVar6 + 0x48;
    } while ((uVar4 & 0xffffffff) * 0x48 != lVar6);
  }
  return;
}

Assistant:

void LiteScript::State::Save(std::ostream &stream, const State &state) {
    OStreamer streamer(stream);
    streamer << state.instr_index << state.line_num;
    streamer << state.nsp_global->ID;
    streamer << state.args_tmp.size();
    for (unsigned int i = 0, sz_i = state.args_tmp.size(); i < sz_i; i++) {
        streamer << state.args_tmp[i].size();
        for (unsigned int j = 0, sz_j = state.args_tmp[i].size(); j < sz_j; j++)
            streamer << state.args_tmp[i][j]->ID;
    }
    streamer << state.args_def.size();
    for (unsigned int i = 0, sz_i = state.args_def.size(); i < sz_i; i++) {
        streamer << state.args_def[i].size();
        for (unsigned int j = 0, sz_j = state.args_def[i].size(); j < sz_j; j++)
            streamer << state.args_def[i][j]->ID;
    }
    streamer << state.ths.size();
    for (unsigned int i = 0, sz = state.ths.size(); i < sz; i++) {
        if (state.ths[i].isNull)
            streamer << (unsigned char)0;
        else
            streamer << (unsigned char)1 << (*state.ths[i])->ID;
    }
    streamer << state.rets.size();
    for (unsigned int i = 0, sz = state.rets.size(); i < sz; i++) {
        if (state.rets[i].isNull)
            streamer << (unsigned char)0;
        else
            streamer << (unsigned char)1 << (*state.rets[i])->ID;
    }
    streamer << state.op_lifo.size();
    for (unsigned int i = 0, sz = state.op_lifo.size(); i < sz; i++)
        streamer << state.op_lifo[i]->ID;
    streamer << state.call_lifo.size();
    for (unsigned int i = 0, sz = state.call_lifo.size(); i < sz; i++)
        streamer << state.call_lifo[i][0] << state.call_lifo[i][1];
    streamer << state.nsp_lifo.size();
    for (unsigned int i = 0, sz = state.nsp_lifo.size(); i < sz; i++)
        state.nsp_lifo[i].SaveIDs(stream);
 }